

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_util.c
# Opt level: O1

int test_kvtree_util_set_get_unsigned_long(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  kvtree *kvtree;
  unsigned_long roundtrip;
  long local_38;
  long local_30;
  
  local_30 = 0;
  local_38 = kvtree_new();
  bVar3 = local_38 == 0;
  iVar1 = kvtree_util_set_unsigned_long(local_38,"KEY",0x11);
  iVar2 = kvtree_util_get_unsigned_long(local_38,"KEY",&local_30);
  bVar4 = local_30 != 0x11;
  kvtree_delete(&local_38);
  return (uint)((bVar4 || (iVar1 != 0 || bVar3)) || iVar2 != 0);
}

Assistant:

int test_kvtree_util_set_get_unsigned_long(){
  int rc = TEST_PASS;
  char* key = "KEY";
  unsigned long value = 17;
  unsigned long roundtrip = 0;

  kvtree* kvtree = kvtree_new();

  if(kvtree == NULL) rc = TEST_FAIL;
  if(kvtree_util_set_unsigned_long(kvtree, key, value) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(kvtree_util_get_unsigned_long(kvtree, key, &roundtrip) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(roundtrip != value) rc = TEST_FAIL;

  kvtree_delete(&kvtree);
  return rc;
}